

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::on_port_mapping
          (session_impl *this,port_mapping_t mapping,address *external_ip,int port,
          portmap_protocol proto,error_code *ec,portmap_transport transport,listen_socket_handle *ls
          )

{
  listen_socket_t *plVar1;
  listen_port_mapping *plVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  portmap_protocol local_61;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_60;
  int local_5c;
  address local_58;
  
  local_61 = proto;
  local_60.m_val = mapping.m_val;
  local_5c = port;
  plVar1 = listen_socket_handle::get(ls);
  if ((ec->failed_ == true) && (((this->m_alerts).m_alert_mask._M_i.m_val & 5) != 0)) {
    if (plVar1 == (listen_socket_t *)0x0) {
      local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_58.ipv6_address_.scope_id_ = 0;
      local_58.type_ = ipv4;
      local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    }
    else {
      bVar3 = (plVar1->local_endpoint).impl_.data_.base.sa_family != 2;
      if (bVar3) {
        local_58.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 8);
        local_58.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 0x10);
        local_58.ipv6_address_.scope_id_ =
             (unsigned_long)(plVar1->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_58.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(plVar1->local_endpoint).impl_.data_.v4.sin_addr.s_addr;
        local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_58.ipv6_address_.scope_id_ = 0;
      }
      local_58.type_ = (anon_enum_32)bVar3;
    }
    alert_manager::
    emplace_alert<libtorrent::portmap_error_alert,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>const&,libtorrent::portmap_transport_const&,boost::system::error_code_const&,boost::asio::ip::address>
              (&this->m_alerts,&local_60,&transport,ec,&local_58);
  }
  if (plVar1 == (listen_socket_t *)0x0) {
    return;
  }
  if (ec->failed_ == false) {
    if (external_ip->type_ == ipv4) {
      if ((external_ip->ipv4_address_).addr_.s_addr != 0) goto LAB_002cac14;
    }
    else {
      auVar4[0] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0] == '\0');
      auVar4[1] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[1] == '\0');
      auVar4[2] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[2] == '\0');
      auVar4[3] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[3] == '\0');
      auVar4[4] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[4] == '\0');
      auVar4[5] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[5] == '\0');
      auVar4[6] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[6] == '\0');
      auVar4[7] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[7] == '\0');
      auVar4[8] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[8] == '\0');
      auVar4[9] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[9] == '\0');
      auVar4[10] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[10] == '\0');
      auVar4[0xb] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] == '\0');
      auVar4[0xc] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] == '\0');
      auVar4[0xd] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] == '\0');
      auVar4[0xe] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] == '\0');
      auVar4[0xf] = -((external_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] == '\0');
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf
                  ) != 0xffff) {
LAB_002cac14:
        local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_58.ipv6_address_.scope_id_ = 0;
        local_58.type_ = ipv4;
        local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        ip_voter::cast_vote(&plVar1->external_address,external_ip,(ip_source_t)0x10,&local_58);
      }
    }
  }
  if (proto == udp) {
    if ((plVar1->udp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>._M_elems
        [transport].mapping.m_val != local_60.m_val) goto LAB_002cac85;
    plVar2 = (plVar1->udp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
             _M_elems + transport;
  }
  else {
    if ((proto != tcp) ||
       ((plVar1->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>._M_elems
        [transport].mapping.m_val != local_60.m_val)) goto LAB_002cac85;
    plVar2 = (plVar1->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
             _M_elems + transport;
  }
  plVar2->port = port;
LAB_002cac85:
  if ((ec->failed_ == false) && (((this->m_alerts).m_alert_mask._M_i.m_val & 4) != 0)) {
    bVar3 = (plVar1->local_endpoint).impl_.data_.base.sa_family != 2;
    if (bVar3) {
      local_58.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 8);
      local_58.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 0x10);
      local_58.ipv6_address_.scope_id_ =
           (unsigned_long)(plVar1->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_58.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(plVar1->local_endpoint).impl_.data_.v4.sin_addr.s_addr;
      local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_58.ipv6_address_.scope_id_ = 0;
    }
    local_58.type_ = (anon_enum_32)bVar3;
    alert_manager::
    emplace_alert<libtorrent::portmap_alert,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>const&,int&,libtorrent::portmap_transport_const&,libtorrent::portmap_protocol_const&,boost::asio::ip::address>
              (&this->m_alerts,&local_60,&local_5c,&transport,&local_61,&local_58);
  }
  return;
}

Assistant:

void session_impl::on_port_mapping(port_mapping_t const mapping
		, address const& external_ip, int port
		, portmap_protocol const proto, error_code const& ec
		, portmap_transport const transport
		, listen_socket_handle const& ls)
	{
		TORRENT_ASSERT(is_single_thread());

		listen_socket_t* listen_socket = ls.get();

		// NOTE: don't assume that if ec != 0, the rest of the logic
		// is not necessary, the ports still need to be set, in other
		// words, don't early return without careful review of the
		// remaining logic
		if (ec && m_alerts.should_post<portmap_error_alert>())
		{
			m_alerts.emplace_alert<portmap_error_alert>(mapping
				, transport, ec, listen_socket ? listen_socket->local_endpoint.address() : address());
		}

		if (!listen_socket) return;

		if (!ec && !external_ip.is_unspecified())
		{
			// TODO: 1 report the proper address of the router as the source IP of
			// this vote of our external address, instead of the empty address
			listen_socket->external_address.cast_vote(external_ip, source_router, address());
		}

		// need to check whether this mapping is for one of session ports (it could also be a user mapping)
		if ((proto == portmap_protocol::tcp) && (listen_socket->tcp_port_mapping[transport].mapping == mapping))
			listen_socket->tcp_port_mapping[transport].port = port;
		else if ((proto == portmap_protocol::udp) && (listen_socket->udp_port_mapping[transport].mapping == mapping))
			listen_socket->udp_port_mapping[transport].port = port;

		if (!ec && m_alerts.should_post<portmap_alert>())
		{
			m_alerts.emplace_alert<portmap_alert>(mapping, port
				, transport, proto, listen_socket->local_endpoint.address());
		}
	}